

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall csv::CSVStat::CSVStat(CSVStat *this,string_view filename,CSVFormat *format)

{
  string_view filename_00;
  CSVFormat local_90;
  CSVStat *local_38;
  char *pcStack_30;
  CSVFormat *local_28;
  CSVFormat *format_local;
  CSVStat *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (CSVStat *)filename._M_len;
  local_28 = format;
  format_local = (CSVFormat *)this;
  std::vector<long_double,_std::allocator<long_double>_>::vector(&this->rolling_means);
  std::vector<long_double,_std::allocator<long_double>_>::vector(&this->rolling_vars);
  std::vector<long_double,_std::allocator<long_double>_>::vector(&this->mins);
  std::vector<long_double,_std::allocator<long_double>_>::vector(&this->maxes);
  std::
  vector<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ::vector(&this->counts);
  std::
  vector<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>,_std::allocator<std::unordered_map<csv::DataType,_unsigned_long,_std::hash<csv::DataType>,_std::equal_to<csv::DataType>,_std::allocator<std::pair<const_csv::DataType,_unsigned_long>_>_>_>_>
  ::vector(&this->dtypes);
  std::vector<long_double,_std::allocator<long_double>_>::vector(&this->n);
  local_38 = this_local;
  pcStack_30 = (char *)filename_local._M_len;
  CSVFormat::CSVFormat(&local_90,format);
  filename_00._M_str = pcStack_30;
  filename_00._M_len = (size_t)local_38;
  CSVReader::CSVReader(&this->reader,filename_00,&local_90);
  CSVFormat::~CSVFormat(&local_90);
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->records).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::deque(&this->records);
  calc(this);
  return;
}

Assistant:

CSV_INLINE CSVStat::CSVStat(csv::string_view filename, CSVFormat format) :
        reader(filename, format) {
        this->calc();
    }